

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::OurReader::recoverFromError(OurReader *this,TokenType skipUntilToken)

{
  _Map_pointer ppEVar1;
  _Map_pointer ppEVar2;
  _Elt_pointer pEVar3;
  _Elt_pointer pEVar4;
  _Elt_pointer pEVar5;
  _Elt_pointer pEVar6;
  Token skip;
  int local_58;
  Token local_48;
  
  ppEVar1 = (this->errors_).
            super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppEVar2 = (this->errors_).
            super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  pEVar3 = (this->errors_).
           super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pEVar4 = (this->errors_).
           super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_first;
  pEVar5 = (this->errors_).
           super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pEVar6 = (this->errors_).
           super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  do {
    readToken(this,&local_48);
    if (local_48.type_ == skipUntilToken) break;
  } while (local_48.type_ != tokenEndOfStream);
  local_58 = (int)ppEVar2;
  std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::resize
            (&this->errors_,
             (long)(int)((int)((ulong)((long)pEVar6 - (long)pEVar5) >> 6) +
                         (int)((ulong)((long)pEVar3 - (long)pEVar4) >> 6) +
                        (((int)ppEVar1 - local_58) + (uint)(ppEVar1 != (_Map_pointer)0x0) * -8 &
                        0xfffffff8)));
  return false;
}

Assistant:

bool OurReader::recoverFromError(TokenType skipUntilToken) {
  int errorCount = int(errors_.size());
  Token skip;
  for (;;) {
    if (!readToken(skip))
      errors_.resize(errorCount); // discard errors caused by recovery
    if (skip.type_ == skipUntilToken || skip.type_ == tokenEndOfStream)
      break;
  }
  errors_.resize(errorCount);
  return false;
}